

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O0

void mandelbrot_colorize(int max_iterations,Gradient *gradient,
                        vector<PixelColor,_std::allocator<PixelColor>_> *image_data,
                        vector<int,_std::allocator<int>_> *iterations_histogram,
                        vector<CalculationResult,_std::allocator<CalculationResult>_>
                        *results_per_point)

{
  pointer this;
  bool bVar1;
  PixelColor PVar2;
  reference pCVar3;
  reference pvVar4;
  const_reference pvVar5;
  float fVar6;
  float pos_in_gradient;
  float smoothed_iteration;
  value_type iter_next;
  value_type iter_curr;
  CalculationResult *results;
  const_iterator __end1;
  const_iterator __begin1;
  vector<CalculationResult,_std::allocator<CalculationResult>_> *__range1;
  undefined1 local_48 [4];
  int pixel;
  vector<float,_std::allocator<float>_> equalized_iterations;
  vector<CalculationResult,_std::allocator<CalculationResult>_> *results_per_point_local;
  vector<int,_std::allocator<int>_> *iterations_histogram_local;
  vector<PixelColor,_std::allocator<PixelColor>_> *image_data_local;
  Gradient *gradient_local;
  int max_iterations_local;
  
  equalized_iterations.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)results_per_point;
  equalize_histogram((vector<float,_std::allocator<float>_> *)local_48,iterations_histogram,
                     max_iterations);
  this = equalized_iterations.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  __range1._4_4_ = 0;
  __end1 = std::vector<CalculationResult,_std::allocator<CalculationResult>_>::begin
                     ((vector<CalculationResult,_std::allocator<CalculationResult>_> *)
                      equalized_iterations.super__Vector_base<float,_std::allocator<float>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  results = (CalculationResult *)
            std::vector<CalculationResult,_std::allocator<CalculationResult>_>::end
                      ((vector<CalculationResult,_std::allocator<CalculationResult>_> *)this);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_CalculationResult_*,_std::vector<CalculationResult,_std::allocator<CalculationResult>_>_>
                      (&__end1,(__normal_iterator<const_CalculationResult_*,_std::vector<CalculationResult,_std::allocator<CalculationResult>_>_>
                                *)&results);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pCVar3 = __gnu_cxx::
             __normal_iterator<const_CalculationResult_*,_std::vector<CalculationResult,_std::allocator<CalculationResult>_>_>
             ::operator*(&__end1);
    if (pCVar3->iter == max_iterations) {
      pvVar4 = std::vector<PixelColor,_std::allocator<PixelColor>_>::operator[]
                         (image_data,(long)__range1._4_4_);
      pvVar4->r = '\0';
      pvVar4->g = '\0';
      pvVar4->b = '\0';
    }
    else {
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_48,(long)pCVar3->iter);
      fVar6 = *pvVar5;
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_48,(long)(pCVar3->iter + 1)
                         );
      fVar6 = std::lerp(fVar6,*pvVar5,pCVar3->distance_to_next_iteration);
      PVar2 = color_from_gradient(gradient,fVar6 / (float)max_iterations);
      pvVar4 = std::vector<PixelColor,_std::allocator<PixelColor>_>::operator[]
                         (image_data,(long)__range1._4_4_);
      pvVar4->r = (char)PVar2._0_2_;
      pvVar4->g = (char)((ushort)PVar2._0_2_ >> 8);
      pvVar4->b = PVar2.b;
    }
    __range1._4_4_ = __range1._4_4_ + 1;
    __gnu_cxx::
    __normal_iterator<const_CalculationResult_*,_std::vector<CalculationResult,_std::allocator<CalculationResult>_>_>
    ::operator++(&__end1);
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_48);
  return;
}

Assistant:

void mandelbrot_colorize(const int max_iterations, const Gradient& gradient,
                         std::vector<PixelColor>& image_data, const std::vector<int>& iterations_histogram, const std::vector<CalculationResult>& results_per_point) noexcept
{
    const auto equalized_iterations = equalize_histogram(iterations_histogram, max_iterations);
    int pixel = 0;

    for (auto& results : results_per_point) {
        if (results.iter == max_iterations) {
            // points inside the Mandelbrot Set are always painted black
            image_data[static_cast<std::size_t>(pixel)] = PixelColor{0, 0, 0};
        } else {
            // The equalized iteration value (in the range of 0 .. max_iterations) represents the
            // position of the pixel color in the color gradiant and needs to be mapped to 0.0 .. 1.0.
            // To achieve smooth coloring we need to edge the equalized iteration towards the next
            // iteration, determined by the distance between the two iterations.
            const auto iter_curr = equalized_iterations[static_cast<std::size_t>(results.iter)];
            const auto iter_next = equalized_iterations[static_cast<std::size_t>(results.iter + 1)];

            const auto smoothed_iteration = std::lerp(iter_curr, iter_next, results.distance_to_next_iteration);
            const auto pos_in_gradient = smoothed_iteration / static_cast<float>(max_iterations);

            image_data[static_cast<std::size_t>(pixel)] = color_from_gradient(gradient, pos_in_gradient);
        }

        ++pixel;
    }
}